

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedate.c
# Opt level: O1

time_t curl_getdate(char *p,time_t *now)

{
  ushort uVar1;
  int iVar2;
  uint uVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  ushort **ppuVar8;
  int *piVar9;
  long lVar10;
  int iVar11;
  int i;
  uint uVar12;
  long lVar13;
  byte bVar14;
  char **what;
  char **ppcVar15;
  bool bVar16;
  bool bVar17;
  int secnum;
  int minnum;
  int hournum;
  char *end;
  uint local_84;
  int local_7c;
  int local_78;
  int local_74;
  int local_70;
  int local_6c;
  ulong local_68;
  ulong local_60;
  byte *local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  byte *local_38;
  
  local_6c = -1;
  local_70 = -1;
  local_78 = -1;
  local_7c = -1;
  bVar17 = false;
  local_68 = 0xffffffff;
  iVar6 = 0;
  local_84 = 0xffffffff;
  uVar12 = 0xffffffff;
  lVar13 = 0xffffffff;
  local_38 = (byte *)p;
  do {
    bVar14 = *p;
    if ((bVar14 == 0) || (5 < iVar6)) {
      if (local_7c == -1) {
        local_6c = 0;
        local_70 = 0;
        local_7c = 0;
      }
      iVar6 = (int)local_68;
      if (local_84 == 0xffffffff) {
        return -1;
      }
      if (uVar12 == 0xffffffff) {
        return -1;
      }
      if (iVar6 == -1) {
        return -1;
      }
      if (iVar6 < 0x7b2) {
        return 0;
      }
      if ((0x3c < local_7c || 0x3b < local_70) ||
          (0x17 < local_6c || (0xb < (int)uVar12 || 0x1f < (int)local_84))) {
        return -1;
      }
      uVar7 = uVar12;
      if ((int)uVar12 < 0) {
        uVar7 = (0xb - uVar12) / 0xc;
        iVar6 = iVar6 + uVar7;
        uVar7 = (uVar7 * 0xc - (0xb - uVar12)) + 0xb;
      }
      iVar11 = iVar6 - (uint)((int)uVar12 < 2);
      iVar5 = (iVar6 - (uint)((int)uVar12 < 2)) + 3;
      if (-1 < iVar11) {
        iVar5 = iVar11;
      }
      iVar2 = (int)((ulong)((long)iVar11 * -0x51eb851f) >> 0x20);
      lVar13 = (((long)local_6c +
                ((long)(int)local_84 + (long)(iVar6 + -0x7b2) * 0x16d +
                 (long)*(int *)(my_timegm_month_days_cumulative + (ulong)uVar7 * 4) +
                (long)(iVar11 / 400 + ((iVar2 >> 5) - (iVar2 >> 0x1f)) + (iVar5 >> 2) + -0x1dd)) *
                0x18) * 0x3c + (long)local_70) * 0x3c;
      if (local_78 == -1) {
        local_78 = 0;
      }
      lVar10 = 0;
      if (local_7c + (int)lVar13 != 0x1517f) {
        lVar10 = (long)local_78;
      }
      return lVar10 + lVar13 + local_7c + -0x15180;
    }
    ppuVar8 = __ctype_b_loc();
    do {
      if (((*ppuVar8)[bVar14] & 8) != 0) break;
      bVar14 = ((byte *)p)[1];
      p = (char *)((byte *)p + 1);
    } while (bVar14 != 0);
    uVar1 = (*ppuVar8)[(byte)*p];
    if ((uVar1 >> 10 & 1) == 0) {
      if ((uVar1 >> 0xb & 1) != 0) {
        if ((local_7c == -1) &&
           (iVar5 = __isoc99_sscanf(p,"%02d:%02d:%02d",&local_6c,&local_70,&local_7c), iVar5 == 3))
        {
          p = (char *)((byte *)p + 8);
LAB_004c7d1c:
          bVar16 = true;
        }
        else {
          if ((local_7c == -1) &&
             (iVar5 = __isoc99_sscanf(p,"%02d:%02d",&local_6c,&local_70), iVar5 == 2)) {
            p = (char *)((byte *)p + 5);
            local_7c = 0;
            goto LAB_004c7d1c;
          }
          local_74 = iVar6;
          piVar9 = __errno_location();
          iVar5 = *piVar9;
          *piVar9 = 0;
          lVar10 = strtol(p,(char **)&local_58,10);
          iVar6 = local_74;
          iVar11 = *piVar9;
          if (iVar11 != iVar5) {
            *piVar9 = iVar5;
          }
          bVar16 = false;
          if ((iVar11 == 0) && (0xfffffffeffffffff < lVar10 - 0x80000000U)) {
            uVar7 = curlx_sltosi(lVar10);
            if (local_78 == -1) {
              local_78 = -1;
              bVar16 = false;
              if (((local_38 < p) && (bVar16 = false, (long)local_58 - (long)p == 4)) &&
                 (bVar16 = false, (int)uVar7 < 0x579)) {
                bVar14 = ((byte *)p)[-1];
                if ((bVar14 != 0x2d) && (bVar14 != 0x2b)) goto LAB_004c7e96;
                iVar5 = uVar7 + ((int)uVar7 / 100) * -0x28;
                local_78 = iVar5 * -0x3c;
                if (bVar14 != 0x2b) {
                  local_78 = iVar5 * 0x3c;
                }
                bVar16 = true;
              }
            }
            else {
LAB_004c7e96:
              bVar16 = false;
            }
            if ((((long)local_58 - (long)p == 8) && ((int)local_68 == -1)) &&
               ((uVar12 == 0xffffffff && (local_84 == 0xffffffff)))) {
              local_68 = (ulong)(uint)((int)uVar7 / 10000);
              uVar12 = ((int)uVar7 % 10000) / 100 - 1;
              local_84 = (int)uVar7 % 100;
              bVar16 = true;
            }
            uVar3 = 0xffffffff;
            bVar4 = bVar16;
            if (uVar7 - 1 < 0x1f) {
              bVar4 = true;
              uVar3 = uVar7;
            }
            if ((bool)(!bVar17 & ~bVar16 & local_84 == 0xffffffff)) {
              bVar17 = true;
              local_84 = uVar3;
              bVar16 = bVar4;
            }
            if (((!bVar16) && (bVar17)) && ((int)local_68 == -1)) {
              if ((int)uVar7 < 0x76c) {
                if ((int)uVar7 < 0x47) {
                  uVar7 = uVar7 + 2000;
                }
                else {
                  uVar7 = uVar7 + 0x76c;
                }
              }
              local_68 = (ulong)uVar7;
              bVar17 = local_84 != 0xffffffff;
              bVar16 = true;
            }
            if (bVar16) {
              p = (char *)local_58;
            }
          }
        }
        if (!bVar16) {
          bVar16 = false;
          goto LAB_004c809d;
        }
      }
LAB_004c8098:
      bVar16 = true;
      iVar6 = iVar6 + 1;
    }
    else {
      local_48 = 0;
      uStack_40 = 0;
      local_58 = (byte *)0x0;
      uStack_50 = 0;
      iVar5 = __isoc99_sscanf(p,"%31[ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz]",
                              &local_58);
      if (iVar5 == 0) {
        local_60 = 0;
      }
      else {
        local_60 = strlen((char *)&local_58);
      }
      if ((int)lVar13 == -1) {
        ppcVar15 = Curl_wkday;
        if (3 < local_60) {
          ppcVar15 = weekday;
        }
        lVar13 = 0;
        local_74 = iVar6;
        do {
          iVar6 = Curl_raw_equal((char *)&local_58,ppcVar15[lVar13]);
          if (iVar6 != 0) goto LAB_004c7d7d;
          lVar13 = lVar13 + 1;
        } while ((int)lVar13 != 7);
        lVar13 = 0xffffffff;
LAB_004c7d7d:
        bVar16 = (int)lVar13 != -1;
      }
      else {
        bVar16 = false;
        local_74 = iVar6;
      }
      if ((!bVar16) && (uVar12 == 0xffffffff)) {
        uVar12 = 0;
        ppcVar15 = Curl_month;
        do {
          iVar6 = Curl_raw_equal((char *)&local_58,*ppcVar15);
          if (iVar6 != 0) goto LAB_004c7dc3;
          ppcVar15 = ppcVar15 + 1;
          uVar12 = uVar12 + 1;
        } while (uVar12 != 0xc);
        uVar12 = 0xffffffff;
LAB_004c7dc3:
        bVar16 = uVar12 != 0xffffffff;
      }
      if ((!bVar16) && (local_78 == -1)) {
        lVar10 = 0;
        do {
          iVar6 = Curl_raw_equal((char *)&local_58,tz[0].name + lVar10);
          if (iVar6 != 0) {
            local_78 = *(int *)(tz[0].name + lVar10 + 8) * 0x3c;
            goto LAB_004c7f40;
          }
          lVar10 = lVar10 + 0xc;
        } while ((int)lVar10 != 0x330);
        local_78 = -1;
LAB_004c7f40:
        bVar16 = false;
        if (local_78 != -1) {
          bVar16 = true;
        }
      }
      iVar6 = local_74;
      if (bVar16) {
        p = (char *)((byte *)p + local_60);
        goto LAB_004c8098;
      }
      bVar16 = false;
    }
LAB_004c809d:
    if (!bVar16) {
      return -1;
    }
  } while( true );
}

Assistant:

time_t curl_getdate(const char *p, const time_t *now)
{
  time_t parsed;
  int rc = parsedate(p, &parsed);
  (void)now; /* legacy argument from the past that we ignore */

  switch(rc) {
  case PARSEDATE_OK:
  case PARSEDATE_LATER:
  case PARSEDATE_SOONER:
    return parsed;
  }
  /* everything else is fail */
  return -1;
}